

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CategoricalMapping::~CategoricalMapping(CategoricalMapping *this)

{
  ~CategoricalMapping(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

CategoricalMapping::~CategoricalMapping() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CategoricalMapping)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}